

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerCudaFatbinaryRule
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  string *name;
  char local_d1;
  string local_d0;
  cmAlphaNum local_b0;
  string local_70;
  cmAlphaNum local_50;
  string *local_20;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmNinjaNormalTargetGenerator *)__return_storage_ptr__;
  TargetLinkLanguage(&local_70,this,config);
  cmAlphaNum::cmAlphaNum(&local_50,&local_70);
  cmAlphaNum::cmAlphaNum(&local_b0,"_FATBINARY__");
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_d0,name);
  local_d1 = '_';
  cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
            (__return_storage_ptr__,&local_50,&local_b0,&local_d0,&local_d1,local_20);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerCudaFatbinaryRule(
  const std::string& config) const
{
  return cmStrCat(
    this->TargetLinkLanguage(config), "_FATBINARY__",
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName()),
    '_', config);
}